

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_reg_read_batch2(uc_engine *uc,int *regs,void **vals,size_t *sizes,int count)

{
  uc_mode uVar1;
  reg_read_t p_Var2;
  void *pvVar3;
  uc_err uVar4;
  uc_err err;
  void *value;
  int local_50;
  uint regid;
  int i;
  int mode;
  void *env;
  reg_read_t reg_read;
  int __init_ret;
  int count_local;
  size_t *sizes_local;
  void **vals_local;
  int *regs_local;
  uc_engine *uc_local;
  
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    p_Var2 = uc->reg_read;
    pvVar3 = uc->cpu->env_ptr;
    uVar1 = uc->mode;
    for (local_50 = 0; local_50 < count; local_50 = local_50 + 1) {
      uVar4 = (*p_Var2)(pvVar3,uVar1,regs[local_50],vals[local_50],sizes + local_50);
      if (uVar4 != UC_ERR_OK) {
        return uVar4;
      }
    }
    uc_local._4_4_ = UC_ERR_OK;
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_reg_read_batch2(uc_engine *uc, int *regs, void *const *vals,
                          size_t *sizes, int count)
{
    UC_INIT(uc);
    reg_read_t reg_read = uc->reg_read;
    void *env = uc->cpu->env_ptr;
    int mode = uc->mode;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        void *value = vals[i];
        uc_err err = reg_read(env, mode, regid, value, sizes + i);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}